

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> *
readFile(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
         *__return_storage_ptr__,string *file)

{
  char cVar1;
  bool bVar2;
  string res;
  ifstream in;
  long *local_270;
  long local_268;
  long local_260 [2];
  long *local_250 [2];
  long local_240 [2];
  long local_230 [29];
  undefined8 auStack_148 [36];
  
  std::ifstream::ifstream(local_230,(string *)file,_S_in);
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    bVar2 = false;
  }
  else {
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)local_250,
               *(undefined8 *)((long)auStack_148 + *(long *)(local_230[0] + -0x18)),0xffffffff,0,
               0xffffffff);
    std::__cxx11::string::operator=((string *)&local_270,(string *)local_250);
    if (local_250[0] != local_240) {
      operator_delete(local_250[0],local_240[0] + 1);
    }
    bVar2 = true;
  }
  std::ifstream::close();
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_270,local_268 + (long)local_270);
  __return_storage_ptr__->second = bVar2;
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  std::ifstream::~ifstream(local_230);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, bool> readFile(const std::string& file)
{
	std::ifstream in(file);
	std::string res = "";
	bool exists = false;
	if (in.is_open())
	{
		exists = true;
		res = { std::istreambuf_iterator<char>(in), std::istreambuf_iterator<char>() };
	}
    in.close();
	return std::make_pair(res, exists);
}